

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

uint16_t compress(uint16_t x,int bits)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  crypto_word_t cVar4;
  crypto_word_t cVar5;
  uint32_t remainder;
  uint32_t quotient;
  uint64_t product;
  uint32_t shifted;
  int bits_local;
  uint16_t x_local;
  
  uVar1 = (uint)x << ((byte)bits & 0x1f);
  lVar3 = (ulong)uVar1 * 0x13af;
  uVar1 = uVar1 + (int)((ulong)lVar3 >> 0x18) * -0xd01;
  iVar2 = constant_time_declassify_int((uint)(uVar1 < 0x1a02));
  if (iVar2 != 0) {
    cVar4 = constant_time_lt_w(0x680,(ulong)uVar1);
    cVar5 = constant_time_lt_w(0x1381,(ulong)uVar1);
    return (short)((ulong)lVar3 >> 0x18) + ((ushort)cVar4 & 1) + ((ushort)cVar5 & 1) &
           (short)(1 << ((byte)bits & 0x1f)) - 1U;
  }
  __assert_fail("constant_time_declassify_int(remainder < 2u * kPrime)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                ,0x215,"uint16_t compress(uint16_t, int)");
}

Assistant:

static uint16_t compress(uint16_t x, int bits) {
  uint32_t shifted = (uint32_t)x << bits;
  uint64_t product = (uint64_t)shifted * kBarrettMultiplier;
  uint32_t quotient = (uint32_t)(product >> kBarrettShift);
  uint32_t remainder = shifted - quotient * kPrime;

  // Adjust the quotient to round correctly:
  //   0 <= remainder <= kHalfPrime round to 0
  //   kHalfPrime < remainder <= kPrime + kHalfPrime round to 1
  //   kPrime + kHalfPrime < remainder < 2 * kPrime round to 2
  declassify_assert(remainder < 2u * kPrime);
  quotient += 1 & constant_time_lt_w(kHalfPrime, remainder);
  quotient += 1 & constant_time_lt_w(kPrime + kHalfPrime, remainder);
  return quotient & ((1 << bits) - 1);
}